

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlSchemaValPtr xmlSchemaDateNormalize(xmlSchemaValPtr dt,double offset)

{
  ushort *puVar1;
  xmlSchemaValType xVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  xmlSchemaValPtr pxVar7;
  xmlSchemaValPtr pxVar8;
  xmlSchemaValPtr value;
  xmlSchemaValType xVar9;
  ulong uVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  xmlChar *pxVar14;
  xmlChar *pxVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  long lStack_60;
  
  if (((XML_SCHEMAS_DATETIME < dt->type) ||
      ((0xc10U >> (dt->type & XML_SCHEMAS_NPINTEGER) & 1) == 0)) ||
     ((*(ushort *)((long)&dt->value + 0x18) & 0x1ffe) == 0)) {
    pxVar7 = xmlSchemaDupVal(dt);
    return pxVar7;
  }
  pxVar7 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (pxVar7 == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  *(undefined8 *)pxVar7 = 0;
  pxVar7->next = (_xmlSchemaVal *)0x0;
  (pxVar7->value).decimal.hi = 0;
  *(undefined8 *)((long)&pxVar7->value + 0x18) = 0;
  (pxVar7->value).decimal.lo = 0;
  (pxVar7->value).decimal.mi = 0;
  pxVar7->type = XML_SCHEMAS_DURATION;
  (pxVar7->value).date.sec = 0.0 - offset;
  xVar2 = dt->type;
  pxVar8 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (pxVar8 == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  *(undefined8 *)pxVar8 = 0;
  pxVar8->next = (_xmlSchemaVal *)0x0;
  (pxVar8->value).decimal.hi = 0;
  *(undefined8 *)((long)&pxVar8->value + 0x18) = 0;
  (pxVar8->value).decimal.lo = 0;
  (pxVar8->value).decimal.mi = 0;
  pxVar8->type = xVar2;
  value = xmlSchemaDupVal(dt);
  if (value == (xmlSchemaValPtr)0x0) {
    value = pxVar8;
    pxVar8 = (xmlSchemaValPtr)0x0;
    goto LAB_001c5548;
  }
  uVar5 = (value->value).hex.total;
  if ((uVar5 & 0xf) == 0) {
    (value->value).hex.total = uVar5 | 1;
  }
  (pxVar7->value).date.sec =
       (pxVar7->value).date.sec -
       (double)(((int)(short)((value->value).decimal.extra << 3) >> 4) * 0x3c);
  puVar1 = (ushort *)((long)&value->value + 0x18);
  *puVar1 = *puVar1 & 0xe001;
  uVar5 = (value->value).hex.total;
  if ((uVar5 & 0x1f0) == 0) {
    uVar5 = uVar5 | 0x10;
    (value->value).hex.total = uVar5;
  }
  dVar16 = (double)(long)((pxVar7->value).qname.name + ((ulong)(uVar5 & 0xf) - 1));
  dVar17 = floor(dVar16 / 12.0);
  uVar5 = (pxVar8->value).hex.total;
  uVar12 = (uint)(long)((dVar16 - dVar17 * 12.0) + 1.0) & 0xf;
  (pxVar8->value).hex.total = uVar5 & 0xfffffff0 | uVar12;
  pxVar14 = (value->value).qname.name + (long)dVar17;
  (pxVar8->value).date.year = (long)pxVar14;
  if (pxVar14 == (xmlChar *)0x0) {
    pxVar14 = (xmlChar *)((ulong)((value->value).date.year < 1) * 2 + -1);
    (pxVar8->value).date.year = (long)pxVar14;
  }
  uVar4 = *(ushort *)((long)&value->value + 0x18) & 0x1ffe;
  uVar3 = (ushort)(pxVar8->value).decimal.extra;
  *(ushort *)((long)&pxVar8->value + 0x18) = uVar3 & 0xe001 | uVar4;
  *(ushort *)((long)&pxVar8->value + 0x18) =
       uVar3 & 0xe000 | uVar4 | *(ushort *)((long)&value->value + 0x18) & 1;
  dVar17 = (value->value).date.sec + (pxVar7->value).date.sec;
  dVar16 = floor((double)(long)dVar17 / 60.0);
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    dVar18 = floor(dVar17 / 60.0);
    dVar17 = dVar17 - dVar18 * 60.0;
  }
  (pxVar8->value).date.sec = dVar17;
  dVar16 = (double)(long)((ulong)((value->value).hex.total >> 0xe & 0x3f) + (long)dVar16);
  dVar18 = floor(dVar16 / 60.0);
  uVar6 = ((uint)(long)(dVar16 - dVar18 * 60.0) & 0x3f) << 0xe;
  (pxVar8->value).hex.total = uVar5 & 0xfff03ff0 | uVar12 | uVar6;
  dVar16 = (double)(long)((ulong)((value->value).hex.total >> 9 & 0x1f) + (long)dVar18);
  dVar18 = floor(dVar16 / 24.0);
  uVar6 = uVar5 & 0xfff001f0 | uVar12 | uVar6 | ((uint)(long)(dVar16 - dVar18 * 24.0) & 0x1f) << 9;
  (pxVar8->value).hex.total = uVar6;
  uVar5 = (value->value).hex.total >> 4 & 0x1f;
  if (uVar12 - 1 < 0xc) {
    if (((long)pxVar14 % 400 == 0) || (((ulong)pxVar14 & 3) == 0 && (long)pxVar14 % 100 != 0)) {
      puVar11 = daysInMonthLeap;
    }
    else {
      puVar11 = daysInMonth;
    }
    uVar12 = puVar11[uVar12 - 1];
    if (uVar12 < uVar5) goto LAB_001c5325;
  }
  uVar12 = uVar5 + (uVar5 == 0);
LAB_001c5325:
  pxVar15 = (pxVar7->value).qname.uri + (ulong)uVar12 + (long)dVar18;
  do {
    uVar5 = uVar6 & 0xf;
    if ((long)pxVar15 < 1) {
      dVar16 = floor((double)(int)(uVar5 - 2) / 12.0);
      uVar13 = (ulong)(((double)(int)(uVar5 - 2) - dVar16 * 12.0) + 1.0);
      if ((long)uVar13 < 2) {
        uVar13 = 1;
      }
      if (0xb < (long)uVar13) {
        uVar13 = 0xc;
      }
      uVar10 = -(ulong)(pxVar14 + (long)dVar16 == (xmlChar *)0x0) | (ulong)(pxVar14 + (long)dVar16);
      puVar11 = daysInMonthLeap;
      if ((long)uVar10 % 100 == 0) {
        puVar11 = daysInMonth;
      }
      if ((uVar10 & 3) != 0) {
        puVar11 = daysInMonth;
      }
      if ((long)uVar10 % 400 == 0) {
        puVar11 = daysInMonthLeap;
      }
      uVar13 = (ulong)puVar11[(uVar13 & 0xffffffff) - 1];
      lStack_60 = -1;
    }
    else {
      uVar12 = uVar5 - 1;
      if (0xb < uVar12) break;
      if (((long)pxVar14 % 400 == 0) || (((ulong)pxVar14 & 3) == 0 && (long)pxVar14 % 100 != 0)) {
        uVar12 = daysInMonthLeap[uVar12];
      }
      else {
        uVar12 = daysInMonth[uVar12];
      }
      if (pxVar15 <= (xmlChar *)(ulong)uVar12) break;
      uVar13 = -(long)(ulong)uVar12;
      lStack_60 = 1;
    }
    pxVar15 = pxVar15 + uVar13;
    dVar16 = (double)((int)((ulong)uVar5 + lStack_60) + -1);
    dVar18 = floor(dVar16 / 12.0);
    uVar6 = uVar6 & 0xfffffff0 | (uint)(long)((dVar16 - dVar18 * 12.0) + 1.0) & 0xf;
    (pxVar8->value).hex.total = uVar6;
    pxVar14 = pxVar14 + (long)dVar18;
    if (pxVar14 == (xmlChar *)0x0) {
      pxVar14 = (xmlChar *)((ulong)(0 < (long)((ulong)uVar5 + lStack_60)) * 2 + -1);
    }
    (pxVar8->value).date.year = (long)pxVar14;
  } while( true );
  uVar12 = (uint)pxVar15 & 0x1f;
  (pxVar8->value).hex.total = uVar6 & 0xfffffe0f | uVar12 << 4;
  xVar2 = pxVar8->type;
  if (xVar2 != XML_SCHEMAS_DATETIME) {
    xVar9 = XML_SCHEMAS_DATETIME;
    if (((dVar17 == 0.0) && (!NAN(dVar17))) && ((uVar6 & 0xffe00) == 0)) {
      if (xVar2 == XML_SCHEMAS_DATE) goto LAB_001c5548;
      if ((uVar5 == 1) || (uVar12 == 1)) {
        if (xVar2 == XML_SCHEMAS_GYEARMONTH || uVar5 == 1) goto LAB_001c5548;
        xVar9 = XML_SCHEMAS_GYEARMONTH;
      }
      else {
        xVar9 = XML_SCHEMAS_DATE;
      }
    }
    pxVar8->type = xVar9;
  }
LAB_001c5548:
  xmlSchemaFreeValue(value);
  if (pxVar8 == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  xmlSchemaFreeValue(pxVar7);
  return pxVar8;
}

Assistant:

static xmlSchemaValPtr
xmlSchemaDateNormalize (xmlSchemaValPtr dt, double offset)
{
    xmlSchemaValPtr dur, ret;

    if (dt == NULL)
        return NULL;

    if (((dt->type != XML_SCHEMAS_TIME) &&
         (dt->type != XML_SCHEMAS_DATETIME) &&
	 (dt->type != XML_SCHEMAS_DATE)) || (dt->value.date.tzo == 0))
        return xmlSchemaDupVal(dt);

    dur = xmlSchemaNewValue(XML_SCHEMAS_DURATION);
    if (dur == NULL)
        return NULL;

    dur->value.date.sec -= offset;

    ret = _xmlSchemaDateAdd(dt, dur);
    if (ret == NULL)
        return NULL;

    xmlSchemaFreeValue(dur);

    /* ret->value.date.tzo = 0; */
    return ret;
}